

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::toLower(QLocale *this,QString *str)

{
  long lVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString result;
  bool ok;
  QString *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  bool *ok_00;
  QString *str_00;
  QLocalePrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ok_00 = (bool *)&DAT_aaaaaaaaaaaaaaaa;
  str_00 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QLocalePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4d39c5);
  QLocalePrivate::toLower(this_00,str_00,ok_00);
  QString::QString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QString::~QString((QString *)0x4d3a3f);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocale::toLower(const QString &str) const
{
#if !defined(QT_BOOTSTRAPPED) && (QT_CONFIG(icu) || defined(Q_OS_WIN) || defined(Q_OS_APPLE))
    bool ok = true;
    const QString result = d->toLower(str, &ok);
    if (ok)
        return result;
    // else fall through and use Qt's toLower
#endif
    return str.toLower();
}